

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

LoopHeader * __thiscall Js::FunctionBody::GetLoopHeaderWithLock(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LoopHeader *pLVar4;
  undefined4 *puVar5;
  
  pLVar4 = FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                     ((FunctionProxy *)this);
  if (pLVar4 == (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b28,"(this->GetLoopHeaderArrayWithLock() != nullptr)",
                                "this->GetLoopHeaderArrayWithLock() != nullptr");
    if (!bVar2) goto LAB_006c80f3;
    *puVar5 = 0;
  }
  uVar3 = GetLoopCount(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b29,"(index < GetLoopCount())","index < GetLoopCount()");
    if (!bVar2) {
LAB_006c80f3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pLVar4 = FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                     ((FunctionProxy *)this);
  return pLVar4 + index;
}

Assistant:

LoopHeader *FunctionBody::GetLoopHeaderWithLock(uint index) const
    {
        Assert(this->GetLoopHeaderArrayWithLock() != nullptr);
        Assert(index < GetLoopCount());
        return &this->GetLoopHeaderArrayWithLock()[index];
    }